

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

_Bool Curl_cpool_conn_now_idle(Curl_easy *data,connectdata *conn)

{
  byte bVar1;
  curl_trc_feat *pcVar2;
  byte bVar3;
  cpool *cpool;
  connectdata *conn_00;
  uint uVar4;
  _Bool _Var5;
  curltime cVar6;
  
  uVar4 = data->multi->maxconnects;
  if (uVar4 == 0) {
    uVar4 = data->multi->num_easy << 2;
  }
  cpool = cpool_get_instance(data);
  cVar6 = Curl_now();
  (conn->lastused).tv_sec = cVar6.tv_sec;
  (conn->lastused).tv_usec = cVar6.tv_usec;
  _Var5 = true;
  if ((cpool != (cpool *)0x0) && (uVar4 != 0)) {
    bVar1 = cpool->field_0x98;
    if ((bVar1 & 1) == 0) {
      bVar3 = bVar1;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
        bVar3 = cpool->field_0x98;
      }
      cpool->field_0x98 = bVar3 | 1;
    }
    _Var5 = true;
    if ((ulong)uVar4 < cpool->num_conn) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Connection pool is full, closing the oldest one");
      }
      conn_00 = cpool_get_oldest_idle(cpool);
      _Var5 = conn_00 != conn;
      if (conn_00 != (connectdata *)0x0) {
        Curl_cpool_disconnect(cpool->idata,conn_00,false);
      }
    }
    if ((bVar1 & 1) == 0) {
      cpool->field_0x98 = cpool->field_0x98 & 0xfe;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
      }
    }
  }
  return _Var5;
}

Assistant:

bool Curl_cpool_conn_now_idle(struct Curl_easy *data,
                              struct connectdata *conn)
{
  unsigned int maxconnects = !data->multi->maxconnects ?
    data->multi->num_easy * 4: data->multi->maxconnects;
  struct connectdata *oldest_idle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  bool kept = TRUE;

  conn->lastused = Curl_now(); /* it was used up until now */
  if(cpool && maxconnects) {
    /* may be called form a callback already under lock */
    bool do_lock = !CPOOL_IS_LOCKED(cpool);
    if(do_lock)
      CPOOL_LOCK(cpool);
    if(cpool->num_conn > maxconnects) {
      infof(data, "Connection pool is full, closing the oldest one");

      oldest_idle = cpool_get_oldest_idle(cpool);
      kept = (oldest_idle != conn);
      if(oldest_idle) {
        Curl_cpool_disconnect(cpool->idata, oldest_idle, FALSE);
      }
    }
    if(do_lock)
      CPOOL_UNLOCK(cpool);
  }

  return kept;
}